

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

int maintain_version(char *file,int forcep)

{
  FileName *pFVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int highest_p;
  char ver [16];
  char fname [255];
  char old_file [4096];
  char dir [4096];
  char vless [4096];
  
  iVar3 = unpack_filename(file,dir,fname,ver,1);
  if (iVar3 == 0) {
    return 0;
  }
  iVar3 = true_name(dir);
  if (iVar3 != -1) {
    return 0;
  }
  iVar3 = get_version_array(dir,fname);
  if (iVar3 == 0) {
    return 0;
  }
  if ((VA.files)->version_no == 0xffffffff) {
    return 1;
  }
  if (((VA.files)->version_no == 0) && (VA.files[1].version_no == 0xffffffff)) {
    if (forcep == 0) {
      return 1;
    }
    get_versionless(VA.files,vless,dir);
    strcpy(fname,vless);
    sVar5 = strlen(fname);
    (fname + sVar5)[0] = '.';
    (fname + sVar5)[1] = '~';
    fname[sVar5 + 2] = '\0';
    sVar5 = strlen(fname);
    (fname + sVar5)[0] = '1';
    (fname + sVar5)[1] = '\0';
    sVar5 = strlen(fname);
    (fname + sVar5)[0] = '~';
    (fname + sVar5)[1] = '\0';
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      iVar3 = link(vless,fname);
      if (iVar3 != -1) {
LAB_001189a7:
        alarm(0);
        return 1;
      }
    } while (*piVar4 == 4);
  }
  else {
    pcVar6 = dir;
    iVar3 = get_versionless(VA.files,vless,pcVar6);
    pFVar1 = VA.files;
    if (iVar3 != 0) {
      iVar3 = check_vless_link(vless,VA.files,old_file,&highest_p);
      if (iVar3 == 0) {
        return 0;
      }
      if (old_file[0] != '\0') {
        if (highest_p != 0) {
          return 1;
        }
        alarm(TIMEOUT_TIME);
        piVar4 = __errno_location();
LAB_001187c5:
        *piVar4 = 0;
        iVar3 = unlink(vless);
        if (iVar3 == -1) goto code_r0x001187da;
        alarm(0);
        pFVar1 = VA.files;
        for (pcVar7 = pcVar6;
            (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
            pcVar7 = pcVar7 + 1) {
          pcVar6 = pcVar2;
        }
        if (pcVar7 + -1 == pcVar6) {
          if (pcVar6 == dir) {
            old_file[0] = '/';
            old_file[1] = '\0';
          }
          else {
            strcpy(old_file,dir);
          }
        }
        else {
          strcpy(old_file,dir);
          sVar5 = strlen(old_file);
          (old_file + sVar5)[0] = '/';
          (old_file + sVar5)[1] = '\0';
        }
        strcat(old_file,pFVar1->name);
        strcpy(fname,pFVar1->name);
        separate_version(fname,ver,1);
        pcVar6 = dir;
        for (pcVar7 = pcVar6;
            (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
            pcVar7 = pcVar7 + 1) {
          pcVar6 = pcVar2;
        }
        if (pcVar7 + -1 == pcVar6) {
          if (pcVar6 == dir) {
            vless[0] = '/';
            vless[1] = '\0';
          }
          else {
            strcpy(vless,dir);
          }
        }
        else {
          strcpy(vless,dir);
          sVar5 = strlen(vless);
          (vless + sVar5)[0] = '/';
          (vless + sVar5)[1] = '\0';
        }
        strcat(vless,fname);
        alarm(TIMEOUT_TIME);
        do {
          *piVar4 = 0;
          iVar3 = link(old_file,vless);
          if (iVar3 != -1) {
LAB_00118ca2:
            alarm(0);
            return 1;
          }
        } while (*piVar4 == 4);
        goto LAB_00118c85;
      }
      sprintf(ver,"%u",(ulong)((VA.files)->version_no + 1));
      strcpy(old_file,vless);
      if (ver[0] != '\0') {
        sVar5 = strlen(old_file);
        (old_file + sVar5)[0] = '.';
        (old_file + sVar5)[1] = '~';
        old_file[sVar5 + 2] = '\0';
        strcat(old_file,ver);
        sVar5 = strlen(old_file);
        (old_file + sVar5)[0] = '~';
        (old_file + sVar5)[1] = '\0';
      }
      alarm(TIMEOUT_TIME);
      piVar4 = __errno_location();
      do {
        *piVar4 = 0;
        iVar3 = link(vless,old_file);
        if (iVar3 != -1) goto LAB_001189a7;
      } while (*piVar4 == 4);
LAB_00118c85:
      alarm(0);
      iVar3 = *piVar4;
      goto LAB_00118c91;
    }
    pcVar6 = dir;
    for (pcVar7 = pcVar6; (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
        pcVar7 = pcVar7 + 1) {
      pcVar6 = pcVar2;
    }
    if (pcVar7 + -1 == pcVar6) {
      if (pcVar6 == dir) {
        old_file[0] = '/';
        old_file[1] = '\0';
      }
      else {
        strcpy(old_file,dir);
      }
    }
    else {
      strcpy(old_file,dir);
      sVar5 = strlen(old_file);
      (old_file + sVar5)[0] = '/';
      (old_file + sVar5)[1] = '\0';
    }
    strcat(old_file,pFVar1->name);
    strcpy(fname,pFVar1->name);
    separate_version(fname,ver,1);
    pcVar6 = dir;
    for (pcVar7 = pcVar6; (pcVar2 = pcVar7, *pcVar7 == '/' || (pcVar2 = pcVar6, *pcVar7 != '\0'));
        pcVar7 = pcVar7 + 1) {
      pcVar6 = pcVar2;
    }
    if (pcVar7 + -1 == pcVar6) {
      if (pcVar6 == dir) {
        vless[0] = '/';
        vless[1] = '\0';
      }
      else {
        strcpy(vless,dir);
      }
    }
    else {
      strcpy(vless,dir);
      sVar5 = strlen(vless);
      (vless + sVar5)[0] = '/';
      (vless + sVar5)[1] = '\0';
    }
    strcat(vless,fname);
    alarm(TIMEOUT_TIME);
    piVar4 = __errno_location();
    do {
      *piVar4 = 0;
      iVar3 = link(old_file,vless);
      if (iVar3 != -1) goto LAB_00118ca2;
    } while (*piVar4 == 4);
  }
  alarm(0);
  iVar3 = *piVar4;
LAB_00118c91:
  *Lisp_errno = iVar3;
  return 0;
code_r0x001187da:
  if (*piVar4 != 4) goto LAB_00118c85;
  goto LAB_001187c5;
}

Assistant:

static int maintain_version(char *file, int forcep)
{
  char dir[MAXPATHLEN], fname[MAXNAMLEN], ver[VERSIONLEN];
  char old_file[MAXPATHLEN], vless[MAXPATHLEN];
  int highest_p;
  int rval, max_no;
  FileName *entry;

  if (unpack_filename(file, dir, fname, ver, 1) == 0) return (0);
  /*
   * We have to make sure that dir is the existing directory.
   */
  if (true_name(dir) != -1) return (0);
  if (get_version_array(dir, fname) == 0) return (0);

  if (NoFileP(VA.files)) {
    /*
     * We don't need to care about such case that there is no such file
     * or an only versionless file exists.
     */
    return (1);
  }

  if (OnlyVersionlessP(VA.files)) {
    if (forcep) {
/*
 * If forcep, we link the versionless file to the version
 * 1 file.
 */
#ifndef DOS
      get_versionless(VA.files, vless, dir);
      ConcNameAndVersion(vless, "1", fname);
      TIMEOUT(rval = link(vless, fname));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (0);
      }
#endif /* DOS */
    }
    return (1);
  }

  /*
   * At this point, we are sure that at least one file with version number
   * exists.  Thus, FindHighestVersion works fine from now on.
   */

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is not a versionless file, but at least one versioned file.
     * Thus, the thing we have to do is to link a versionless file
     * to the existing highest versioned file.
     */
    FindHighestVersion(VA.files, entry, max_no);
    ConcDirAndName(dir, entry->name, old_file);
/*
 * The versionless file should have the same case name as the old
 * file.
 */
#ifndef DOS
    strcpy(fname, entry->name);
    separate_version(fname, ver, 1);
    ConcDirAndName(dir, fname, vless);
    TIMEOUT(rval = link(old_file, vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }

  if (check_vless_link(vless, VA.files, old_file, &highest_p) == 0) return (0);

  if (*old_file == '\0') {
    /*
     * The versionless file is not linked to any file in VA.files.
     * Thus, we have to link the versionless file to the file which
     * is versioned one higher than the existing highest version.
     */
    FindHighestVersion(VA.files, entry, max_no);
    sprintf(ver, "%u", max_no + 1);
/*
 * The old file should have the same case name as the versionless
 * file.
 */
#ifndef DOS
    ConcNameAndVersion(vless, ver, old_file);
    TIMEOUT(rval = link(vless, old_file));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }

  if (highest_p) {
    /*
     * The versionless file has been already linked to the highest
     * versioned file.  Thus, there is nothing to do.
     */
    return (1);
  } else {
    /*
     * Although the  versionless file is linked to a file in VA.files,
     * the file is not the highest versioned file.  We have to unlink
     * the wrongly linked versionless file, and link the highest versioned
     * file to a versionless file.
     */
    TIMEOUT(rval = unlink(vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
    FindHighestVersion(VA.files, entry, max_no);
    ConcDirAndName(dir, entry->name, old_file);
/*
 * The versionless file should have the same case name as the old
 * file.
 */
#ifndef DOS
    strcpy(fname, entry->name);
    separate_version(fname, ver, 1);
    ConcDirAndName(dir, fname, vless);
    TIMEOUT(rval = link(old_file, vless));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (0);
    }
#endif /* DOS */
    return (1);
  }
}